

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void __thiscall QHostAddress::setAddress(QHostAddress *this,SpecialAddress address)

{
  quint8 *pqVar1;
  QHostAddressPrivate *pQVar2;
  uint in_ESI;
  Q_IPV6ADDR *in_RDI;
  long in_FS_OFFSET;
  quint32 ip4;
  Q_IPV6ADDR ip6;
  QHostAddress *in_stack_ffffffffffffffd0;
  QIPv6Address local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  clear(in_stack_ffffffffffffffd0);
  local_18.c[0] = '\0';
  local_18.c[1] = '\0';
  local_18.c[2] = '\0';
  local_18.c[3] = '\0';
  local_18.c[4] = '\0';
  local_18.c[5] = '\0';
  local_18.c[6] = '\0';
  local_18.c[7] = '\0';
  local_18.c[8] = '\0';
  local_18.c[9] = '\0';
  local_18.c[10] = '\0';
  local_18.c[0xb] = '\0';
  local_18.c[0xc] = '\0';
  local_18.c[0xd] = '\0';
  local_18.c[0xe] = '\0';
  local_18.c[0xf] = '\0';
  pQVar2 = (QHostAddressPrivate *)(ulong)in_ESI;
  switch(pQVar2) {
  case (QHostAddressPrivate *)0x0:
    goto LAB_00217004;
  case (QHostAddressPrivate *)0x1:
    break;
  case (QHostAddressPrivate *)0x2:
    break;
  case (QHostAddressPrivate *)0x3:
    pqVar1 = QIPv6Address::operator[](&local_18,0xf);
    *pqVar1 = '\x01';
  case (QHostAddressPrivate *)0x5:
    QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216fd1);
    QHostAddressPrivate::setAddress(pQVar2,in_RDI);
    goto LAB_00217004;
  case (QHostAddressPrivate *)0x4:
    pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216fe9);
    pQVar2->protocol = '\x02';
    goto LAB_00217004;
  case (QHostAddressPrivate *)0x6:
  }
  QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216ff8);
  QHostAddressPrivate::setAddress(pQVar2,(quint32)((ulong)in_RDI >> 0x20));
LAB_00217004:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostAddress::setAddress(SpecialAddress address)
{
    clear();

    Q_IPV6ADDR ip6;
    memset(&ip6, 0, sizeof ip6);
    quint32 ip4 = INADDR_ANY;

    switch (address) {
    case Null:
        return;

    case Broadcast:
        ip4 = INADDR_BROADCAST;
        break;
    case LocalHost:
        ip4 = INADDR_LOOPBACK;
        break;
    case AnyIPv4:
        break;

    case LocalHostIPv6:
        ip6[15] = 1;
        Q_FALLTHROUGH();
    case AnyIPv6:
        d->setAddress(ip6);
        return;

    case Any:
        d->protocol = QHostAddress::AnyIPProtocol;
        return;
    }

    // common IPv4 part
    d->setAddress(ip4);
}